

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

bool tinyobj::LoadObjWithCallback
               (istream *inStream,callback_t *callback,void *user_data,MaterialReader *readMatFn,
               string *warn,string *err)

{
  byte bVar1;
  _Alloc_hider _Var2;
  pointer pbVar3;
  pointer pbVar4;
  istream *is;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  long lVar9;
  code *pcVar10;
  iterator iVar11;
  long *plVar12;
  undefined8 uVar13;
  long *plVar14;
  ulong uVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *elems;
  _Rb_tree_color _Var16;
  byte *pbVar17;
  index_t *piVar18;
  ulong uVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  pointer pbVar21;
  bool bVar22;
  byte *pbVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_register_00001304 [12];
  string namebuf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> indices;
  string linebuf;
  vector<const_char_*,_std::allocator<const_char_*>_> names_out;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  index_t idx;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  material_map;
  stringstream errss;
  value_type local_4b0;
  string *local_490;
  void *local_488;
  allocator local_479;
  pointer local_478;
  pointer local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  index_t *local_448;
  iterator iStack_440;
  index_t *local_438;
  string *local_430;
  long *local_428;
  long local_420;
  long local_418;
  long lStack_410;
  string local_408;
  vector<const_char_*,_std::allocator<const_char_*>_> local_3e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c8;
  ios_base *local_3a8;
  MaterialReader *local_3a0;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> local_398;
  pointer local_380;
  istream *local_378;
  undefined1 local_370 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360 [7];
  ios_base local_2f0 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_1e8;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  local_490 = warn;
  local_430 = err;
  local_3a0 = readMatFn;
  local_378 = inStream;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1e8._M_impl.super__Rb_tree_header._M_header;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_438 = (index_t *)0x0;
  local_448 = (index_t *)0x0;
  iStack_440._M_current = (index_t *)0x0;
  local_398.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_398.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_3c8,2);
  local_3e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  local_408._M_string_length = 0;
  local_408.field_2._M_local_buf[0] = '\0';
  local_3a8 = local_2f0;
  local_488 = user_data;
LAB_009783b4:
  do {
    while( true ) {
      do {
        do {
          is = local_378;
          iVar5 = std::istream::peek();
          if (iVar5 == -1) {
            if (local_430 != (string *)0x0) {
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::_M_append((char *)local_430,local_370._0_8_);
              if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
                operator_delete((void *)local_370._0_8_,
                                CONCAT71(local_360[0]._M_allocated_capacity._1_7_,
                                         local_360[0]._M_local_buf[0]) + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_408._M_dataplus._M_p != &local_408.field_2) {
              operator_delete(local_408._M_dataplus._M_p,
                              CONCAT71(local_408.field_2._M_allocated_capacity._1_7_,
                                       local_408.field_2._M_local_buf[0]) + 1);
            }
            if ((index_t *)
                local_3e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start != (index_t *)0x0) {
              operator_delete(local_3e8.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_3e8.
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_3e8.
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_3c8);
            std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector
                      (&local_398);
            if (local_448 != (index_t *)0x0) {
              operator_delete(local_448,(long)local_438 - (long)local_448);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::~_Rb_tree(&local_1e8);
            std::__cxx11::stringstream::~stringstream(local_1b8);
            std::ios_base::~ios_base(local_138);
            return true;
          }
          safeGetline(is,&local_408);
          _Var2._M_p = local_408._M_dataplus._M_p;
          if ((local_408._M_string_length != 0) &&
             (local_408._M_dataplus._M_p[local_408._M_string_length - 1] == '\n')) {
            local_408._M_string_length = local_408._M_string_length - 1;
            local_408._M_dataplus._M_p[local_408._M_string_length] = '\0';
          }
          if ((local_408._M_string_length != 0) &&
             (local_408._M_dataplus._M_p[local_408._M_string_length - 1] == '\r')) {
            local_408._M_string_length = local_408._M_string_length - 1;
            local_408._M_dataplus._M_p[local_408._M_string_length] = '\0';
          }
        } while (local_408._M_string_length == 0);
        sVar8 = strspn(local_408._M_dataplus._M_p," \t");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var2._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          __assert_fail("token",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/tinyobjloader/tiny_obj_loader.h"
                        ,0xaa3,
                        "bool tinyobj::LoadObjWithCallback(std::istream &, const callback_t &, void *, MaterialReader *, std::string *, std::string *)"
                       );
        }
        pbVar17 = (byte *)(_Var2._M_p + sVar8);
        bVar1 = *pbVar17;
      } while ((bVar1 == 0) || (bVar1 == 0x23));
      if ((bVar1 != 0x76) || ((pbVar17[1] != 0x20 && (pbVar17[1] != 9)))) break;
      sVar8 = strspn((char *)(pbVar17 + 2)," \t");
      pbVar17 = pbVar17 + sVar8 + 2;
      sVar8 = strcspn((char *)pbVar17," \t\r");
      pbVar23 = pbVar17 + sVar8;
      local_370._0_8_ = (pointer)0x0;
      tryParseDouble((char *)pbVar17,(char *)pbVar23,(double *)local_370);
      local_470 = (pointer)local_370._0_8_;
      sVar8 = strspn((char *)pbVar23," \t");
      pbVar23 = pbVar23 + sVar8;
      sVar8 = strcspn((char *)pbVar23," \t\r");
      pbVar17 = pbVar23 + sVar8;
      local_370._0_8_ = (pointer)0x0;
      tryParseDouble((char *)pbVar23,(char *)pbVar17,(double *)local_370);
      local_478 = (pointer)local_370._0_8_;
      sVar8 = strspn((char *)pbVar17," \t");
      pbVar17 = pbVar17 + sVar8;
      sVar8 = strcspn((char *)pbVar17," \t\r");
      pbVar23 = pbVar17 + sVar8;
      local_370._0_8_ = (pointer)0x0;
      tryParseDouble((char *)pbVar17,(char *)pbVar23,(double *)local_370);
      local_380 = (pointer)local_370._0_8_;
      sVar8 = strspn((char *)pbVar23," \t");
      pbVar23 = pbVar23 + sVar8;
      sVar8 = strcspn((char *)pbVar23," \t\r");
      local_370._0_8_ = (pointer)0x3ff0000000000000;
      tryParseDouble((char *)pbVar23,(char *)(pbVar23 + sVar8),(double *)local_370);
      if (*(code **)callback != (code *)0x0) {
        auVar33._0_4_ = (float)(double)local_370._0_8_;
        auVar33._4_12_ = in_register_00001304;
        auVar30._0_4_ = (float)(double)local_380;
        auVar30._4_12_ = in_register_00001304;
        auVar27._0_4_ = (float)(double)local_478;
        auVar27._4_12_ = in_register_00001304;
        auVar24._0_4_ = (float)(double)local_470;
        auVar24._4_12_ = in_register_00001304;
        (**(code **)callback)(auVar24._0_8_,auVar27._0_8_,auVar30._0_8_,auVar33._0_8_,local_488);
      }
    }
    if (bVar1 == 0x76) {
      if ((pbVar17[1] == 0x6e) && ((pbVar17[2] == 0x20 || (pbVar17[2] == 9)))) {
        sVar8 = strspn((char *)(pbVar17 + 3)," \t");
        pbVar17 = pbVar17 + sVar8 + 3;
        sVar8 = strcspn((char *)pbVar17," \t\r");
        pbVar23 = pbVar17 + sVar8;
        local_370._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar17,(char *)pbVar23,(double *)local_370);
        local_470 = (pointer)local_370._0_8_;
        sVar8 = strspn((char *)pbVar23," \t");
        pbVar23 = pbVar23 + sVar8;
        sVar8 = strcspn((char *)pbVar23," \t\r");
        pbVar17 = pbVar23 + sVar8;
        local_370._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar23,(char *)pbVar17,(double *)local_370);
        local_478 = (pointer)local_370._0_8_;
        sVar8 = strspn((char *)pbVar17," \t");
        pbVar17 = pbVar17 + sVar8;
        sVar8 = strcspn((char *)pbVar17," \t\r");
        local_370._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar17,(char *)(pbVar17 + sVar8),(double *)local_370);
        if (*(code **)(callback + 8) != (code *)0x0) {
          auVar31._0_4_ = (float)(double)local_370._0_8_;
          auVar31._4_12_ = in_register_00001304;
          auVar28._0_4_ = (float)(double)local_478;
          auVar28._4_12_ = in_register_00001304;
          auVar25._0_4_ = (float)(double)local_470;
          auVar25._4_12_ = in_register_00001304;
          (**(code **)(callback + 8))(auVar25._0_8_,auVar28._0_8_,auVar31._0_8_,local_488);
        }
        goto LAB_009783b4;
      }
      if ((pbVar17[1] == 0x74) && ((pbVar17[2] == 0x20 || (pbVar17[2] == 9)))) {
        sVar8 = strspn((char *)(pbVar17 + 3)," \t");
        pbVar17 = pbVar17 + sVar8 + 3;
        sVar8 = strcspn((char *)pbVar17," \t\r");
        pbVar23 = pbVar17 + sVar8;
        local_370._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar17,(char *)pbVar23,(double *)local_370);
        local_470 = (pointer)local_370._0_8_;
        sVar8 = strspn((char *)pbVar23," \t");
        pbVar23 = pbVar23 + sVar8;
        sVar8 = strcspn((char *)pbVar23," \t\r");
        pbVar17 = pbVar23 + sVar8;
        local_370._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar23,(char *)pbVar17,(double *)local_370);
        local_478 = (pointer)local_370._0_8_;
        sVar8 = strspn((char *)pbVar17," \t");
        pbVar17 = pbVar17 + sVar8;
        sVar8 = strcspn((char *)pbVar17," \t\r");
        local_370._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar17,(char *)(pbVar17 + sVar8),(double *)local_370);
        if (*(code **)(callback + 0x10) != (code *)0x0) {
          auVar32._0_4_ = (float)(double)local_370._0_8_;
          auVar32._4_12_ = in_register_00001304;
          auVar29._0_4_ = (float)(double)local_478;
          auVar29._4_12_ = in_register_00001304;
          auVar26._0_4_ = (float)(double)local_470;
          auVar26._4_12_ = in_register_00001304;
          (**(code **)(callback + 0x10))(auVar26._0_8_,auVar29._0_8_,auVar32._0_8_,local_488);
        }
        goto LAB_009783b4;
      }
    }
    if ((bVar1 == 0x66) && ((pbVar17[1] == 0x20 || (pbVar17[1] == 9)))) {
      sVar8 = strspn((char *)(pbVar17 + 2)," \t");
      if (iStack_440._M_current != local_448) {
        iStack_440._M_current = local_448;
      }
      pbVar17 = pbVar17 + sVar8 + 2;
      while ((0xd < *pbVar17 || ((0x2401U >> (*pbVar17 & 0x1f) & 1) == 0))) {
        iVar6 = atoi((char *)pbVar17);
        sVar8 = strcspn((char *)pbVar17,"/ \t\r");
        pbVar23 = pbVar17 + sVar8;
        iVar5 = 0;
        if (pbVar17[sVar8] == 0x2f) {
          if (pbVar23[1] == 0x2f) {
            pbVar23 = pbVar23 + 2;
            iVar7 = 0;
          }
          else {
            pbVar17 = pbVar23 + 1;
            iVar7 = atoi((char *)pbVar17);
            sVar8 = strcspn((char *)pbVar17,"/ \t\r");
            pbVar23 = pbVar17 + sVar8;
            if (pbVar17[sVar8] != 0x2f) goto LAB_0097893d;
            pbVar23 = pbVar23 + 1;
          }
          iVar5 = atoi((char *)pbVar23);
          sVar8 = strcspn((char *)pbVar23,"/ \t\r");
          pbVar23 = pbVar23 + sVar8;
        }
        else {
          iVar7 = 0;
          iVar5 = 0;
        }
LAB_0097893d:
        local_370._4_4_ = iVar5;
        local_370._0_4_ = iVar6;
        local_370._8_4_ = iVar7;
        if (iStack_440._M_current == local_438) {
          std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
          _M_realloc_insert<tinyobj::index_t_const&>
                    ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)&local_448,
                     iStack_440,(index_t *)local_370);
        }
        else {
          (iStack_440._M_current)->texcoord_index = iVar7;
          (iStack_440._M_current)->vertex_index = iVar6;
          (iStack_440._M_current)->normal_index = iVar5;
          iStack_440._M_current = iStack_440._M_current + 1;
        }
        sVar8 = strspn((char *)pbVar23," \t\r");
        pbVar17 = pbVar23 + sVar8;
      }
      pcVar10 = *(code **)(callback + 0x18);
      if ((pcVar10 != (code *)0x0) && ((long)iStack_440._M_current - (long)local_448 != 0)) {
        uVar15 = ((long)iStack_440._M_current - (long)local_448 >> 2) * -0x5555555555555555;
        piVar18 = local_448;
LAB_00978c39:
        (*pcVar10)(local_488,piVar18,uVar15);
      }
    }
    else {
      iVar5 = strncmp((char *)pbVar17,"usemtl",6);
      if ((iVar5 == 0) && ((pbVar17[6] == 0x20 || (pbVar17[6] == 9)))) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_370);
        sVar8 = strlen((char *)(pbVar17 + 7));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_370 + 0x10),(char *)(pbVar17 + 7),sVar8);
        std::__cxx11::stringbuf::str();
        iVar11 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::find(&local_1e8,&local_4b0);
        if ((_Rb_tree_header *)iVar11._M_node == &local_1e8._M_impl.super__Rb_tree_header) {
          _Var16 = ~_S_red;
          if ((local_490 != (string *)0x0) && (*(long *)(callback + 0x20) == 0)) {
            std::operator+(&local_468,"material [ ",&local_4b0);
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_468);
            plVar14 = plVar12 + 2;
            if ((long *)*plVar12 == plVar14) {
              local_418 = *plVar14;
              lStack_410 = plVar12[3];
              local_428 = &local_418;
            }
            else {
              local_418 = *plVar14;
              local_428 = (long *)*plVar12;
            }
            local_420 = plVar12[1];
            *plVar12 = (long)plVar14;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_490,(ulong)local_428);
            if (local_428 != &local_418) {
              operator_delete(local_428,local_418 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_dataplus._M_p != &local_468.field_2) {
              operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        else {
          _Var16 = iVar11._M_node[2]._M_color;
        }
        if (*(code **)(callback + 0x20) != (code *)0x0) {
          (**(code **)(callback + 0x20))(local_488,local_4b0._M_dataplus._M_p,_Var16);
        }
LAB_00979030:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
          operator_delete(local_4b0._M_dataplus._M_p,
                          CONCAT71(local_4b0.field_2._M_allocated_capacity._1_7_,
                                   local_4b0.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_370);
        std::ios_base::~ios_base(local_3a8);
      }
      else {
        iVar5 = strncmp((char *)pbVar17,"mtllib",6);
        pbVar4 = local_3c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar3 = local_3c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((iVar5 == 0) && ((pbVar17[6] == 0x20 || (pbVar17[6] == 9)))) {
          if (local_3a0 != (MaterialReader *)0x0) {
            local_468._M_dataplus._M_p = (pointer)0x0;
            local_468._M_string_length = 0;
            local_468.field_2._M_allocated_capacity = 0;
            std::__cxx11::string::string
                      ((string *)local_370,(char *)(pbVar17 + 7),(allocator *)&local_4b0);
            SplitString((string *)local_370,(char)&local_468,elems);
            if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
              operator_delete((void *)local_370._0_8_,
                              CONCAT71(local_360[0]._M_allocated_capacity._1_7_,
                                       local_360[0]._M_local_buf[0]) + 1);
            }
            if (local_468._M_dataplus._M_p == (pointer)local_468._M_string_length) {
              if (local_490 != (string *)0x0) {
                std::__cxx11::string::append((char *)local_490);
              }
            }
            else {
              if ((pointer)local_468._M_string_length != local_468._M_dataplus._M_p) {
                lVar9 = 0;
                uVar15 = 0;
                bVar22 = false;
                do {
                  local_370._0_8_ = local_370 + 0x10;
                  local_370._8_8_ = 0;
                  local_360[0]._M_local_buf[0] = '\0';
                  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
                  local_4b0._M_string_length = 0;
                  local_4b0.field_2._M_local_buf[0] = '\0';
                  std::__cxx11::string::string
                            ((string *)&local_428,*(char **)(local_468._M_dataplus._M_p + lVar9),
                             &local_479);
                  iVar5 = (*local_3a0->_vptr_MaterialReader[2])
                                    (local_3a0,(string *)&local_428,&local_398,&local_1e8,local_370,
                                     &local_4b0);
                  if (local_428 != &local_418) {
                    operator_delete(local_428,local_418 + 1);
                  }
                  if ((local_490 != (string *)0x0) && (local_370._8_8_ != 0)) {
                    std::__cxx11::string::_M_append((char *)local_490,local_370._0_8_);
                  }
                  if ((local_430 != (string *)0x0) && (local_4b0._M_string_length != 0)) {
                    std::__cxx11::string::_M_append
                              ((char *)local_430,(ulong)local_4b0._M_dataplus._M_p);
                  }
                  if ((char)iVar5 != '\0') {
                    bVar22 = true;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
                    operator_delete(local_4b0._M_dataplus._M_p,
                                    CONCAT71(local_4b0.field_2._M_allocated_capacity._1_7_,
                                             local_4b0.field_2._M_local_buf[0]) + 1);
                  }
                  if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
                    operator_delete((void *)local_370._0_8_,
                                    CONCAT71(local_360[0]._M_allocated_capacity._1_7_,
                                             local_360[0]._M_local_buf[0]) + 1);
                  }
                  if ((char)iVar5 != '\0') break;
                  uVar15 = uVar15 + 1;
                  lVar9 = lVar9 + 0x20;
                } while (uVar15 < (ulong)((long)(local_468._M_string_length -
                                                (long)local_468._M_dataplus._M_p) >> 5));
                if (bVar22) {
                  if (*(code **)(callback + 0x28) != (code *)0x0) {
                    if (local_398.
                        super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish ==
                        local_398.
                        super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
LAB_009792bf:
                      uVar13 = std::__throw_out_of_range_fmt
                                         ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                          ,0);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&local_468);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_408._M_dataplus._M_p != &local_408.field_2) {
                        operator_delete(local_408._M_dataplus._M_p,
                                        CONCAT71(local_408.field_2._M_allocated_capacity._1_7_,
                                                 local_408.field_2._M_local_buf[0]) + 1);
                      }
                      if ((index_t *)
                          local_3e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start != (index_t *)0x0) {
                        operator_delete(local_3e8.
                                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_3e8.
                                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_3e8.
                                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector(&local_3c8);
                      std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::
                      ~vector(&local_398);
                      if (local_448 != (index_t *)0x0) {
                        operator_delete(local_448,(long)local_438 - (long)local_448);
                      }
                      std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::~_Rb_tree(&local_1e8);
                      std::__cxx11::stringstream::~stringstream(local_1b8);
                      std::ios_base::~ios_base(local_138);
                      _Unwind_Resume(uVar13);
                    }
                    (**(code **)(callback + 0x28))
                              (local_488,
                               local_398.
                               super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               ((long)local_398.
                                      super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_398.
                                      super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               0x63fb9aeb1fdcd759);
                  }
                  goto LAB_009790a1;
                }
              }
              if (local_490 != (string *)0x0) {
                std::__cxx11::string::append((char *)local_490);
              }
            }
LAB_009790a1:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_468);
          }
        }
        else if (bVar1 == 0x6f) {
          if ((pbVar17[1] == 0x20) || (pbVar17[1] == 9)) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_370);
            sVar8 = strlen((char *)(pbVar17 + 2));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_370 + 0x10),(char *)(pbVar17 + 2),sVar8);
            std::__cxx11::stringbuf::str();
            if (*(code **)(callback + 0x38) != (code *)0x0) {
              (**(code **)(callback + 0x38))(local_488,local_4b0._M_dataplus._M_p);
            }
            goto LAB_00979030;
          }
        }
        else if ((bVar1 == 0x67) && ((pbVar17[1] == 0x20 || (pbVar17[1] == 9)))) {
          if (local_3c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_3c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar20 = &(local_3c8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar12 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(paVar20 + -1))->_M_dataplus)._M_p;
              if (paVar20 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar12) {
                operator_delete(plVar12,paVar20->_M_allocated_capacity + 1);
              }
              pbVar21 = (pointer)(paVar20 + 1);
              paVar20 = paVar20 + 2;
            } while (pbVar21 != pbVar4);
            local_3c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
          }
          while( true ) {
            if ((*pbVar17 < 0xe) && ((0x2401U >> (*pbVar17 & 0x1f) & 1) != 0)) break;
            local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
            local_4b0._M_string_length = 0;
            local_4b0.field_2._M_local_buf[0] = '\0';
            sVar8 = strspn((char *)pbVar17," \t");
            pbVar17 = pbVar17 + sVar8;
            sVar8 = strcspn((char *)pbVar17," \t\r");
            pbVar23 = pbVar17 + sVar8;
            local_370._0_8_ = local_370 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_370,pbVar17,pbVar23);
            std::__cxx11::string::operator=((string *)&local_4b0,(string *)local_370);
            if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
              operator_delete((void *)local_370._0_8_,
                              CONCAT71(local_360[0]._M_allocated_capacity._1_7_,
                                       local_360[0]._M_local_buf[0]) + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_3c8,&local_4b0);
            sVar8 = strspn((char *)pbVar23," \t\r");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
              operator_delete(local_4b0._M_dataplus._M_p,
                              CONCAT71(local_4b0.field_2._M_allocated_capacity._1_7_,
                                       local_4b0.field_2._M_local_buf[0]) + 1);
            }
            pbVar17 = pbVar23 + sVar8;
          }
          if ((long)local_3c8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_3c8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0) {
            __assert_fail("names.size() > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/tinyobjloader/tiny_obj_loader.h"
                          ,0xb42,
                          "bool tinyobj::LoadObjWithCallback(std::istream &, const callback_t &, void *, MaterialReader *, std::string *, std::string *)"
                         );
          }
          if (*(code **)(callback + 0x30) != (code *)0x0) {
            uVar15 = (long)local_3c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_3c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5;
            if (1 < uVar15) {
              std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
                        (&local_3e8,uVar15 - 1);
              if (local_3e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_3e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                uVar15 = 0;
              }
              else {
                lVar9 = 0x20;
                uVar19 = 0;
                do {
                  *(undefined8 *)
                   ((int *)local_3e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar19 * 2) =
                       *(undefined8 *)
                        ((long)&((local_3c8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        lVar9);
                  uVar19 = uVar19 + 1;
                  uVar15 = (long)local_3e8.
                                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_3e8.
                                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3;
                  lVar9 = lVar9 + 0x20;
                } while (uVar19 < uVar15);
              }
              if (local_3e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_3e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,0,uVar15);
                goto LAB_009792bf;
              }
              pcVar10 = *(code **)(callback + 0x30);
              piVar18 = (index_t *)
                        local_3e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              goto LAB_00978c39;
            }
            (**(code **)(callback + 0x30))(local_488,0,0);
          }
        }
      }
    }
  } while( true );
}

Assistant:

bool LoadObjWithCallback(std::istream &inStream, const callback_t &callback,
                         void *user_data /*= NULL*/,
                         MaterialReader *readMatFn /*= NULL*/,
                         std::string *warn, /* = NULL*/
                         std::string *err /*= NULL*/) {
  std::stringstream errss;

  // material
  std::map<std::string, int> material_map;
  int material_id = -1;  // -1 = invalid

  std::vector<index_t> indices;
  std::vector<material_t> materials;
  std::vector<std::string> names;
  names.reserve(2);
  std::vector<const char *> names_out;

  std::string linebuf;
  while (inStream.peek() != -1) {
    safeGetline(inStream, linebuf);

    // Trim newline '\r\n' or '\n'
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\n')
        linebuf.erase(linebuf.size() - 1);
    }
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\r')
        linebuf.erase(linebuf.size() - 1);
    }

    // Skip if empty line.
    if (linebuf.empty()) {
      continue;
    }

    // Skip leading space.
    const char *token = linebuf.c_str();
    token += strspn(token, " \t");

    assert(token);
    if (token[0] == '\0') continue;  // empty line

    if (token[0] == '#') continue;  // comment line

    // vertex
    if (token[0] == 'v' && IS_SPACE((token[1]))) {
      token += 2;
      // TODO(syoyo): Support parsing vertex color extension.
      real_t x, y, z, w;  // w is optional. default = 1.0
      parseV(&x, &y, &z, &w, &token);
      if (callback.vertex_cb) {
        callback.vertex_cb(user_data, x, y, z, w);
      }
      continue;
    }

    // normal
    if (token[0] == 'v' && token[1] == 'n' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;
      parseReal3(&x, &y, &z, &token);
      if (callback.normal_cb) {
        callback.normal_cb(user_data, x, y, z);
      }
      continue;
    }

    // texcoord
    if (token[0] == 'v' && token[1] == 't' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;  // y and z are optional. default = 0.0
      parseReal3(&x, &y, &z, &token);
      if (callback.texcoord_cb) {
        callback.texcoord_cb(user_data, x, y, z);
      }
      continue;
    }

    // face
    if (token[0] == 'f' && IS_SPACE((token[1]))) {
      token += 2;
      token += strspn(token, " \t");

      indices.clear();
      while (!IS_NEW_LINE(token[0])) {
        vertex_index_t vi = parseRawTriple(&token);

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        indices.push_back(idx);
        size_t n = strspn(token, " \t\r");
        token += n;
      }

      if (callback.index_cb && indices.size() > 0) {
        callback.index_cb(user_data, &indices.at(0),
                          static_cast<int>(indices.size()));
      }

      continue;
    }

    // use mtl
    if ((0 == strncmp(token, "usemtl", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      std::stringstream ss;
      ss << token;
      std::string namebuf = ss.str();

      int newMaterialId = -1;
      std::map<std::string, int>::const_iterator it = material_map.find(namebuf);
      if (it != material_map.end()) {
        newMaterialId = it->second;
      } else {
        // { warn!! material not found }
        if (warn && (!callback.usemtl_cb)) {
          (*warn) += "material [ " + namebuf + " ] not found in .mtl\n";
        }
      }

      if (newMaterialId != material_id) {
        material_id = newMaterialId;
      }

      if (callback.usemtl_cb) {
        callback.usemtl_cb(user_data, namebuf.c_str(), material_id);
      }

      continue;
    }

    // load mtl
    if ((0 == strncmp(token, "mtllib", 6)) && IS_SPACE((token[6]))) {
      if (readMatFn) {
        token += 7;

        std::vector<std::string> filenames;
        SplitString(std::string(token), ' ', filenames);

        if (filenames.empty()) {
          if (warn) {
            (*warn) +=
                "Looks like empty filename for mtllib. Use default "
                "material. \n";
          }
        } else {
          bool found = false;
          for (size_t s = 0; s < filenames.size(); s++) {
            std::string warn_mtl;
            std::string err_mtl;
            bool ok = (*readMatFn)(filenames[s].c_str(), &materials,
                                   &material_map, &warn_mtl, &err_mtl);

            if (warn && (!warn_mtl.empty())) {
              (*warn) += warn_mtl;  // This should be warn message.
            }

            if (err && (!err_mtl.empty())) {
              (*err) += err_mtl;
            }

            if (ok) {
              found = true;
              break;
            }
          }

          if (!found) {
            if (warn) {
              (*warn) +=
                  "Failed to load material file(s). Use default "
                  "material.\n";
            }
          } else {
            if (callback.mtllib_cb) {
              callback.mtllib_cb(user_data, &materials.at(0),
                                 static_cast<int>(materials.size()));
            }
          }
        }
      }

      continue;
    }

    // group name
    if (token[0] == 'g' && IS_SPACE((token[1]))) {
      names.clear();

      while (!IS_NEW_LINE(token[0])) {
        std::string str = parseString(&token);
        names.push_back(str);
        token += strspn(token, " \t\r");  // skip tag
      }

      assert(names.size() > 0);

      if (callback.group_cb) {
        if (names.size() > 1) {
          // create const char* array.
          names_out.resize(names.size() - 1);
          for (size_t j = 0; j < names_out.size(); j++) {
            names_out[j] = names[j + 1].c_str();
          }
          callback.group_cb(user_data, &names_out.at(0),
                            static_cast<int>(names_out.size()));

        } else {
          callback.group_cb(user_data, NULL, 0);
        }
      }

      continue;
    }

    // object name
    if (token[0] == 'o' && IS_SPACE((token[1]))) {
      // @todo { multiple object name? }
      token += 2;

      std::stringstream ss;
      ss << token;
      std::string object_name = ss.str();

      if (callback.object_cb) {
        callback.object_cb(user_data, object_name.c_str());
      }

      continue;
    }

#if 0  // @todo
    if (token[0] == 't' && IS_SPACE(token[1])) {
      tag_t tag;

      token += 2;
      std::stringstream ss;
      ss << token;
      tag.name = ss.str();

      token += tag.name.size() + 1;

      tag_sizes ts = parseTagTriple(&token);

      tag.intValues.resize(static_cast<size_t>(ts.num_ints));

      for (size_t i = 0; i < static_cast<size_t>(ts.num_ints); ++i) {
        tag.intValues[i] = atoi(token);
        token += strcspn(token, "/ \t\r") + 1;
      }

      tag.floatValues.resize(static_cast<size_t>(ts.num_reals));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_reals); ++i) {
        tag.floatValues[i] = parseReal(&token);
        token += strcspn(token, "/ \t\r") + 1;
      }

      tag.stringValues.resize(static_cast<size_t>(ts.num_strings));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_strings); ++i) {
        std::stringstream ss;
        ss << token;
        tag.stringValues[i] = ss.str();
        token += tag.stringValues[i].size() + 1;
      }

      tags.push_back(tag);
    }
#endif

    // Ignore unknown command.
  }

  if (err) {
    (*err) += errss.str();
  }

  return true;
}